

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQInteger __thiscall SQSharedState::ResurrectUnreachable(SQSharedState *this,SQVM *vm)

{
  SQArray *pSVar1;
  int iVar2;
  undefined1 local_70 [8];
  SQObjectPtr temp;
  SQObject sqo;
  SQArray *pSStack_48;
  SQObjectType type;
  SQCollectable_conflict *rlast;
  SQArray *ret;
  SQCollectable_conflict *t;
  SQCollectable_conflict *resurrected;
  SQCollectable_conflict *tchain;
  SQInteger n;
  SQVM *vm_local;
  SQSharedState *this_local;
  
  tchain = (SQCollectable_conflict *)0x0;
  resurrected = (SQCollectable_conflict *)0x0;
  n = (SQInteger)vm;
  vm_local = (SQVM *)this;
  RunMark(this,vm,&resurrected);
  pSVar1 = (SQArray *)this->_gc_chain;
  this->_gc_chain = resurrected;
  rlast = (SQCollectable_conflict *)0x0;
  if (pSVar1 != (SQArray *)0x0) {
    rlast = (SQCollectable_conflict *)SQArray::Create(this,0);
    pSStack_48 = (SQArray *)0x0;
    for (ret = pSVar1; ret != (SQArray *)0x0; ret = (SQArray *)(ret->super_SQCollectable)._next) {
      pSStack_48 = ret;
      iVar2 = (*(ret->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[3])();
      if ((iVar2 != 0x8002000) && (iVar2 != 0x8020000)) {
        temp.super_SQObject._unVal.nInteger._0_4_ = iVar2;
        SQArray::Append((SQArray *)rlast,(SQObject *)&temp.super_SQObject._unVal);
      }
      tchain = (SQCollectable_conflict *)
               ((long)&(tchain->super_SQRefCounted)._vptr_SQRefCounted + 1);
    }
    if ((SQCollectable_conflict *)(pSStack_48->super_SQCollectable)._next !=
        (SQCollectable_conflict *)0x0) {
      __assert_fail("rlast->_next == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                    ,0x128,"SQInteger SQSharedState::ResurrectUnreachable(SQVM *)");
    }
    (pSStack_48->super_SQCollectable)._next = (SQCollectable *)this->_gc_chain;
    if (this->_gc_chain != (SQCollectable_conflict *)0x0) {
      this->_gc_chain->_prev = (SQCollectable_conflict *)pSStack_48;
    }
    this->_gc_chain = (SQCollectable_conflict *)pSVar1;
  }
  for (ret = (SQArray *)this->_gc_chain; ret != (SQArray *)0x0;
      ret = (SQArray *)(ret->super_SQCollectable)._next) {
    SQCollectable::UnMark(&ret->super_SQCollectable);
  }
  if (rlast == (SQCollectable_conflict *)0x0) {
    SQVM::PushNull((SQVM *)n);
  }
  else {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_70,(SQArray *)rlast);
    SQVM::Push((SQVM *)n,(SQObjectPtr *)local_70);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_70);
  }
  return (SQInteger)tchain;
}

Assistant:

SQInteger SQSharedState::ResurrectUnreachable(SQVM *vm)
{
    SQInteger n=0;
    SQCollectable *tchain=NULL;

    RunMark(vm,&tchain);

    SQCollectable *resurrected = _gc_chain;
    SQCollectable *t = resurrected;

    _gc_chain = tchain;

    SQArray *ret = NULL;
    if(resurrected) {
        ret = SQArray::Create(this,0);
        SQCollectable *rlast = NULL;
        while(t) {
            rlast = t;
            SQObjectType type = t->GetType();
            if(type != OT_FUNCPROTO && type != OT_OUTER) {
                SQObject sqo;
                sqo._type = type;
                sqo._unVal.pRefCounted = t;
                ret->Append(sqo);
            }
            t = t->_next;
            n++;
        }

        assert(rlast->_next == NULL);
        rlast->_next = _gc_chain;
        if(_gc_chain)
        {
            _gc_chain->_prev = rlast;
        }
        _gc_chain = resurrected;
    }

    t = _gc_chain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }

    if(ret) {
        SQObjectPtr temp = ret;
        vm->Push(temp);
    }
    else {
        vm->PushNull();
    }
    return n;
}